

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O2

callback_t *
end_class_state(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  QDebug *debug;
  QDebug aQStack_38 [8];
  undefined4 local_30;
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined4 local_1c;
  undefined8 local_18;
  
  std::istream::ignore();
  parser();
  if ((parser()::category[0x10] & 1) != 0) {
    parser();
    local_30 = 2;
    local_2c = 0;
    uStack_24 = 0;
    local_1c = 0;
    local_18 = parser()::category._8_8_;
    QMessageLogger::debug();
    debug = QDebug::operator<<(aQStack_38,"finishing class ");
    operator<<(debug,(string *)((anonymous_namespace)::current_class + 0x40));
    QDebug::~QDebug(aQStack_38);
  }
  std::__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> *)
             &(anonymous_namespace)::current_class,
             (__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> *)
             ((anonymous_namespace)::current_class + 0x30));
  if ((anonymous_namespace)::current_class == 0) {
    (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
    __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  }
  else {
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
    *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = class_state;
    __return_storage_ptr__->_M_invoker =
         std::
         _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
         ::_M_invoke;
    (__return_storage_ptr__->super__Function_base)._M_manager =
         std::
         _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
         ::_M_manager;
  }
  return __return_storage_ptr__;
}

Assistant:

callback_t end_class_state(MetaConfiguration &conf, std::ifstream &f,
                           int &error) {
  f.ignore();
  qCDebug(parser) << "finishing class " << current_class->name;
  current_class = current_class->parent;

  if (current_class)
    return class_state;
  return nullptr;
}